

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cpp
# Opt level: O0

void __thiscall unittest::UnitTest::TestExtract(UnitTest *this)

{
  bool bVar1;
  int local_248;
  allocator<char> local_241;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  short local_21c;
  allocator<char> local_219;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  short local_1f4;
  allocator<char> local_1f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  short local_1cc;
  allocator<char> local_1c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  short local_1a4;
  allocator<char> local_1a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  bool local_17a;
  allocator<char> local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  short local_154;
  allocator<char> local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  allocator<char> local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  allocator<char> local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  allocator<char> local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  bool local_4d;
  int local_4c;
  short sStack_46;
  bool bool_;
  int32_t i32;
  int16_t i16;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string str;
  UnitTest *this_local;
  
  str.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"oops",&local_31);
  std::allocator<char>::~allocator(&local_31);
  sStack_46 = 0;
  local_4c = 0;
  local_4d = true;
  std::__cxx11::string::string((string *)&local_70);
  bVar1 = inipp::extract<char>
                    (&local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  Assert::IsTrue(bVar1);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_90);
  Assert::AreEqual<std::__cxx11::string>
            (&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30
            );
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"hello",&local_b1);
  bVar1 = inipp::extract<char>
                    (&local_b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  Assert::IsTrue(bVar1);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"hello",&local_d9);
  Assert::AreEqual<std::__cxx11::string>
            (&local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30
            );
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"hello world",&local_101);
  bVar1 = inipp::extract<char>
                    (&local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  Assert::IsTrue(bVar1);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"hello world",&local_129);
  Assert::AreEqual<std::__cxx11::string>
            (&local_128,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"-10",&local_151);
  bVar1 = inipp::extract<char,short>(&local_150,&stack0xffffffffffffffba);
  Assert::IsTrue(bVar1);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  local_154 = -10;
  Assert::AreEqual<short>(&local_154,&stack0xffffffffffffffba);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"false",&local_179);
  bVar1 = inipp::extract<char,bool>(&local_178,&local_4d);
  Assert::IsTrue(bVar1);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  local_17a = false;
  Assert::AreEqual<bool>(&local_17a,&local_4d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"-10",&local_1a1);
  bVar1 = inipp::extract<char,short>(&local_1a0,&stack0xffffffffffffffba);
  Assert::IsTrue(bVar1);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  local_1a4 = -10;
  Assert::AreEqual<short>(&local_1a4,&stack0xffffffffffffffba);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"xxx",&local_1c9);
  bVar1 = inipp::extract<char,short>(&local_1c8,&stack0xffffffffffffffba);
  Assert::IsFalse(bVar1);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  local_1cc = -10;
  Assert::AreEqual<short>(&local_1cc,&stack0xffffffffffffffba);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"1000000",&local_1f1);
  bVar1 = inipp::extract<char,short>(&local_1f0,&stack0xffffffffffffffba);
  Assert::IsFalse(bVar1);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  local_1f4 = -10;
  Assert::AreEqual<short>(&local_1f4,&stack0xffffffffffffffba);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"-20 xxx",&local_219);
  bVar1 = inipp::extract<char,short>(&local_218,&stack0xffffffffffffffba);
  Assert::IsFalse(bVar1);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  local_21c = -10;
  Assert::AreEqual<short>(&local_21c,&stack0xffffffffffffffba);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"1000000",&local_241);
  bVar1 = inipp::extract<char,int>(&local_240,&local_4c);
  Assert::IsTrue(bVar1);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator(&local_241);
  local_248 = 1000000;
  Assert::AreEqual<int>(&local_248,&local_4c);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_METHOD(TestExtract)
		{
			std::string       str{ "oops" };
			int16_t           i16{ 0 };
			int32_t           i32{ 0 };
			bool              bool_{ true };
			Assert::IsTrue(extract(std::string(), str));
			Assert::AreEqual(std::string{ }, str);
			Assert::IsTrue(extract(std::string{ "hello" }, str));
			Assert::AreEqual(std::string{ "hello" }, str);
			Assert::IsTrue(extract(std::string{ "hello world" }, str));
			Assert::AreEqual(std::string{ "hello world" }, str);
			Assert::IsTrue(extract(std::string{ "-10" }, i16));
			Assert::AreEqual(int16_t{ -10 }, i16);
			Assert::IsTrue(extract(std::string{ "false" }, bool_));
			Assert::AreEqual(false, bool_);
			Assert::IsTrue(extract(std::string{ "-10" }, i16));
			Assert::AreEqual(int16_t{ -10 }, i16);
			Assert::IsFalse(extract(std::string{ "xxx" }, i16));
			Assert::AreEqual(int16_t{ -10 }, i16);
			Assert::IsFalse(extract(std::string{ "1000000" }, i16));
			Assert::AreEqual(int16_t{ -10 }, i16);
			Assert::IsFalse(extract(std::string{ "-20 xxx" }, i16));
			Assert::AreEqual(int16_t{ -10 }, i16);
			Assert::IsTrue(extract(std::string{ "1000000" }, i32));
			Assert::AreEqual(int32_t{ 1000000 }, i32);
		}